

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_ifelse::dump(statement_ifelse *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  _Elt_pointer ppsVar2;
  statement_base **ptr;
  _Elt_pointer ppsVar3;
  _Map_pointer pppsVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginIfElse: Condition = ",0x1b);
  compiler_type::dump_expr((this->mTree).mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n",3);
  ppsVar3 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar3 != ppsVar1) {
    ppsVar2 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar4 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar3)->_vptr_statement_base[5])(*ppsVar3,o);
      ppsVar3 = ppsVar3 + 1;
      if (ppsVar3 == ppsVar2) {
        ppsVar3 = pppsVar4[1];
        pppsVar4 = pppsVar4 + 1;
        ppsVar2 = ppsVar3 + 0x40;
      }
    } while (ppsVar3 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Else >\n",9);
  ppsVar3 = (this->mElseBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mElseBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar3 != ppsVar1) {
    ppsVar2 = (this->mElseBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar4 = (this->mElseBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar3)->_vptr_statement_base[5])(*ppsVar3,o);
      ppsVar3 = ppsVar3 + 1;
      if (ppsVar3 == ppsVar2) {
        ppsVar3 = pppsVar4[1];
        pppsVar4 = pppsVar4 + 1;
        ppsVar2 = ppsVar3 + 0x40;
      }
    } while (ppsVar3 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndIfElse >\n",0xe);
  return;
}

Assistant:

void statement_ifelse::dump(std::ostream &o) const
	{
		o << "< BeginIfElse: Condition = ";
		compiler_type::dump_expr(mTree.root(), o);
		o << " >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< Else >\n";
		for (auto &ptr: mElseBlock)
			ptr->dump(o);
		o << "< EndIfElse >\n";
	}